

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::SupportedCombinationTest::tryCombination
          (SupportedCombinationTest *this,FormatCombination *comb)

{
  GLenum GVar1;
  Functions *pFVar2;
  Framebuffer fbo;
  FboBuilder builder;
  
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&fbo,((this->super_TestBase).m_ctx)->m_renderCtx);
  pFVar2 = deqp::gls::fboc::details::gl(&this->super_TestBase);
  deqp::gls::FboUtil::FboBuilder::FboBuilder
            (&builder,fbo.super_ObjectWrapper.m_object,0x8d40,pFVar2);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8ce0,comb->colorKind,comb->colorFmt,0x40,0x40,&builder);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8d00,comb->depthKind,comb->depthFmt,0x40,0x40,&builder);
  deqp::gls::fboc::details::TestBase::attachTargetToNew
            (&this->super_TestBase,0x8d20,comb->stencilKind,comb->stencilFmt,0x40,0x40,&builder);
  pFVar2 = deqp::gls::fboc::details::gl(&this->super_TestBase);
  GVar1 = (*pFVar2->checkFramebufferStatus)(0x8d40);
  deqp::gls::FboUtil::FboBuilder::~FboBuilder(&builder);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  return GVar1 == 0x8cd5;
}

Assistant:

bool SupportedCombinationTest::tryCombination (const FormatCombination& comb)
{
	glu::Framebuffer fbo(m_ctx.getRenderContext());
	FboBuilder builder(*fbo, GL_FRAMEBUFFER, fboc::gl(*this));

	attachTargetToNew(GL_COLOR_ATTACHMENT0,		comb.colorKind,		comb.colorFmt,
					  64,						64,					builder);
	attachTargetToNew(GL_DEPTH_ATTACHMENT,		comb.depthKind,		comb.depthFmt,
					  64,						64,					builder);
	attachTargetToNew(GL_STENCIL_ATTACHMENT,	comb.stencilKind,	comb.stencilFmt,
					  64,						64,					builder);

	const GLenum glStatus = fboc::gl(*this).checkFramebufferStatus(GL_FRAMEBUFFER);

	return (glStatus == GL_FRAMEBUFFER_COMPLETE);
}